

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

void __thiscall Fl_Text_Buffer::tab_distance(Fl_Text_Buffer *this,int tabDist)

{
  char *__src;
  char *__dest;
  size_t __n;
  int iVar1;
  long lVar2;
  
  iVar1 = this->mLength;
  if (0 < this->mNPredeleteProcs) {
    lVar2 = 0;
    do {
      (*this->mPredeleteProcs[lVar2])(0,iVar1,this->mPredeleteCbArgs[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->mNPredeleteProcs);
    iVar1 = this->mLength;
  }
  this->mTabDist = tabDist;
  __dest = (char *)malloc((long)(iVar1 + 1));
  __src = this->mBuf;
  __n = (size_t)this->mGapStart;
  memcpy(__dest,__src,__n);
  memcpy(__dest + __n,__src + this->mGapEnd,(long)iVar1 - __n);
  __dest[iVar1] = '\0';
  if (0 < this->mNModifyProcs) {
    lVar2 = 0;
    do {
      (*this->mModifyProcs[lVar2])(0,iVar1,iVar1,0,__dest,this->mCbArgs[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->mNModifyProcs);
  }
  free(__dest);
  return;
}

Assistant:

void Fl_Text_Buffer::tab_distance(int tabDist)
{
  /* First call the pre-delete callbacks with the previous tab setting 
   still active. */
  call_predelete_callbacks(0, mLength);
  
  /* Change the tab setting */
  mTabDist = tabDist;
  
  /* Force any display routines to redisplay everything (unfortunately,
   this means copying the whole buffer contents to provide "deletedText" */
  const char *deletedText = text();
  call_modify_callbacks(0, mLength, mLength, 0, deletedText);
  free((void *) deletedText);
}